

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_closest_d(REF_DBL *normal,REF_DBL *m,REF_DBL *d_out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_d8;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL ratio;
  REF_DBL d_in [12];
  double local_50;
  REF_DBL largest_eig;
  REF_DBL largest_dot;
  REF_DBL dot;
  int local_30;
  REF_INT second_i;
  REF_INT first_i;
  REF_INT i;
  REF_DBL *d_out_local;
  REF_DBL *m_local;
  REF_DBL *normal_local;
  
  normal_local._4_4_ = ref_matrix_diag_m(m,&ratio);
  if (normal_local._4_4_ == 0) {
    largest_eig = -2.0;
    local_30 = -1;
    for (second_i = 0; second_i < 3; second_i = second_i + 1) {
      if (normal[2] * d_in[(long)(second_i * 3 + 3) + 1] +
          *normal * d_in[(long)(second_i * 3 + 3) + -1] + normal[1] * d_in[second_i * 3 + 3] <= 0.0)
      {
        local_d8 = -(normal[2] * d_in[(long)(second_i * 3 + 3) + 1] +
                    *normal * d_in[(long)(second_i * 3 + 3) + -1] +
                    normal[1] * d_in[second_i * 3 + 3]);
      }
      else {
        local_d8 = normal[2] * d_in[(long)(second_i * 3 + 3) + 1] +
                   *normal * d_in[(long)(second_i * 3 + 3) + -1] +
                   normal[1] * d_in[second_i * 3 + 3];
      }
      if (largest_eig < local_d8) {
        largest_eig = local_d8;
        local_30 = second_i;
      }
    }
    if (local_30 == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x8f4,"ref_metric_closest_d","first_i not set");
      normal_local._4_4_ = 1;
    }
    else {
      dot._4_4_ = -1;
      local_50 = -1.0;
      for (second_i = 0; second_i < 3; second_i = second_i + 1) {
        if ((second_i != local_30) && ((dot._4_4_ == -1 || (local_50 < d_in[(long)second_i + -1]))))
        {
          dot._4_4_ = second_i;
          local_50 = d_in[(long)second_i + -1];
        }
      }
      if (dot._4_4_ == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x8fe,"ref_metric_closest_d","second_i not set");
        normal_local._4_4_ = 1;
      }
      else if (dot._4_4_ == local_30) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x8ff,"ref_metric_closest_d","first_i same as second_i");
        normal_local._4_4_ = 1;
      }
      else {
        for (second_i = 0; second_i < 3; second_i = second_i + 1) {
          d_out[second_i + 3] = normal[second_i];
        }
        normal_local._4_4_ = ref_math_normalize(d_out + 3);
        if (normal_local._4_4_ == 0) {
          for (second_i = 0; second_i < 3; second_i = second_i + 1) {
            d_out[second_i + 6] = d_in[(long)(second_i + 3 + dot._4_4_ * 3) + -1];
          }
          dVar6 = d_out[3];
          dVar1 = d_out[6];
          dVar2 = d_out[4];
          dVar3 = d_out[7];
          dVar4 = d_out[5];
          dVar5 = d_out[8];
          for (second_i = 0; second_i < 3; second_i = second_i + 1) {
            d_out[second_i + 6] =
                 -(dVar4 * dVar5 + dVar6 * dVar1 + dVar2 * dVar3) * d_in[(long)(second_i + 3) + -1]
                 + d_out[second_i + 6];
          }
          normal_local._4_4_ = ref_math_normalize(d_out + 6);
          if (normal_local._4_4_ == 0) {
            d_out[9] = d_out[4] * d_out[8] + -(d_out[5] * d_out[7]);
            d_out[10] = d_out[5] * d_out[6] + -(d_out[3] * d_out[8]);
            d_out[0xb] = d_out[3] * d_out[7] + -(d_out[4] * d_out[6]);
            normal_local._4_4_ = ref_math_normalize(d_out + 9);
            if (normal_local._4_4_ == 0) {
              dVar6 = sqrt(d_out[5] * (m[5] * d_out[5] + m[2] * d_out[3] + m[4] * d_out[4]) +
                           d_out[3] * (m[2] * d_out[5] + *m * d_out[3] + m[1] * d_out[4]) +
                           d_out[4] * (m[4] * d_out[5] + m[1] * d_out[3] + m[3] * d_out[4]));
              *d_out = dVar6 * dVar6;
              dVar6 = sqrt(d_out[8] * (m[5] * d_out[8] + m[2] * d_out[6] + m[4] * d_out[7]) +
                           d_out[6] * (m[2] * d_out[8] + *m * d_out[6] + m[1] * d_out[7]) +
                           d_out[7] * (m[4] * d_out[8] + m[1] * d_out[6] + m[3] * d_out[7]));
              d_out[1] = dVar6 * dVar6;
              dVar6 = sqrt(d_out[0xb] * (m[5] * d_out[0xb] + m[2] * d_out[9] + m[4] * d_out[10]) +
                           d_out[9] * (m[2] * d_out[0xb] + *m * d_out[9] + m[1] * d_out[10]) +
                           d_out[10] * (m[4] * d_out[0xb] + m[1] * d_out[9] + m[3] * d_out[10]));
              d_out[2] = dVar6 * dVar6;
              normal_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x912,"ref_metric_closest_d",(ulong)normal_local._4_4_,"third");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x90e,"ref_metric_closest_d",(ulong)normal_local._4_4_,"second");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x904,"ref_metric_closest_d",(ulong)normal_local._4_4_,"first");
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x8e8,
           "ref_metric_closest_d",(ulong)normal_local._4_4_,"decomp");
  }
  return normal_local._4_4_;
}

Assistant:

static REF_FCN REF_STATUS ref_metric_closest_d(REF_DBL *normal, REF_DBL *m,
                                               REF_DBL *d_out) {
  REF_INT i, first_i, second_i;
  REF_DBL dot, largest_dot, largest_eig;
  REF_DBL d_in[12];
  REF_DBL ratio;
  RSS(ref_matrix_diag_m(m, d_in), "decomp");
  /* metric eigenvector direction closest to normal */
  largest_dot = -2.0;
  first_i = REF_EMPTY;
  for (i = 0; i < 3; i++) {
    dot = ABS(ref_math_dot(normal, ref_matrix_vec_ptr(d_in, i)));
    if (dot > largest_dot) {
      largest_dot = dot;
      first_i = i;
    }
  }
  /* smallest spacing / largest eigenval direction remaining */
  RUS(REF_EMPTY, first_i, "first_i not set");
  second_i = REF_EMPTY;
  largest_eig = -1.0;
  for (i = 0; i < 3; i++) {
    if (i == first_i) continue;
    if (REF_EMPTY == second_i || ref_matrix_eig(d_in, i) > largest_eig) {
      second_i = i;
      largest_eig = ref_matrix_eig(d_in, i);
    }
  }
  RUS(REF_EMPTY, second_i, "second_i not set");
  RUS(second_i, first_i, "first_i same as second_i");
  /* first eigenvector in normal direction */
  for (i = 0; i < 3; i++) {
    ref_matrix_vec(d_out, i, 0) = normal[i];
  }
  RSS(ref_math_normalize(ref_matrix_vec_ptr(d_out, 0)), "first");
  /* second eigenvector, orthonormal to first eigenvector */
  for (i = 0; i < 3; i++) {
    ref_matrix_vec(d_out, i, 1) = ref_matrix_vec(d_in, i, second_i);
  }
  dot =
      ref_math_dot(ref_matrix_vec_ptr(d_out, 0), ref_matrix_vec_ptr(d_out, 1));
  for (i = 0; i < 3; i++) {
    ref_matrix_vec(d_out, i, 1) -= dot * ref_matrix_vec(d_in, i, 0);
  }
  RSS(ref_math_normalize(ref_matrix_vec_ptr(d_out, 1)), "second");
  ref_math_cross_product(ref_matrix_vec_ptr(d_out, 0),
                         ref_matrix_vec_ptr(d_out, 1),
                         ref_matrix_vec_ptr(d_out, 2));
  RSS(ref_math_normalize(ref_matrix_vec_ptr(d_out, 2)), "third");

  ratio = ref_matrix_sqrt_vt_m_v(m, ref_matrix_vec_ptr(d_out, 0));
  ref_matrix_eig(d_out, 0) = ratio * ratio;

  ratio = ref_matrix_sqrt_vt_m_v(m, ref_matrix_vec_ptr(d_out, 1));
  ref_matrix_eig(d_out, 1) = ratio * ratio;

  ratio = ref_matrix_sqrt_vt_m_v(m, ref_matrix_vec_ptr(d_out, 2));
  ref_matrix_eig(d_out, 2) = ratio * ratio;

  return REF_SUCCESS;
}